

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

bool __thiscall
capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation::tryExpandTo
          (DataLocation *this,Union *u,uint newLgSize)

{
  uint uVar1;
  uint newLgSize_local;
  Union *u_local;
  DataLocation *this_local;
  
  if (this->lgSize < newLgSize) {
    uVar1 = (*u->parent->_vptr_StructOrGroup[3])
                      (u->parent,(ulong)this->lgSize,(ulong)this->offset,
                       (ulong)(newLgSize - this->lgSize));
    if ((uVar1 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      this->offset = this->offset >> ((char)newLgSize - (char)this->lgSize & 0x1fU);
      this->lgSize = newLgSize;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool tryExpandTo(Union& u, uint newLgSize) {
        if (newLgSize <= lgSize) {
          return true;
        } else if (u.parent.tryExpandData(lgSize, offset, newLgSize - lgSize)) {
          offset >>= (newLgSize - lgSize);
          lgSize = newLgSize;
          return true;
        } else {
          return false;
        }
      }